

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_language.cpp
# Opt level: O1

GrammarPtr __thiscall Omega_h::build_grammar(Omega_h *this,Language *language)

{
  _Rb_tree_header *p_Var1;
  pointer pTVar2;
  pointer pPVar3;
  pointer pbVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  mapped_type *pmVar6;
  const_iterator cVar7;
  _Rb_tree_node_base *p_Var8;
  pointer pPVar9;
  ostream *poVar10;
  ParserFail *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Token *token;
  pointer __k;
  pointer pPVar11;
  vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_> *__range1;
  pointer __k_00;
  int iVar12;
  GrammarPtr GVar13;
  Production gprod;
  Grammar out;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  symbol_map;
  stringstream ss;
  int local_27c;
  undefined1 local_278 [8];
  pointer pbStack_270;
  iterator iStack_268;
  int *local_260;
  element_type *local_250;
  pointer local_248;
  Grammar local_240;
  string local_208;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_1e8;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [23];
  
  p_Var1 = &local_1e8._M_impl.super__Rb_tree_header;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  iVar12 = 0;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  __k = (language->tokens).
        super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>.
        _M_impl.super__Vector_impl_data._M_start;
  pTVar2 = (language->tokens).
           super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_250 = (element_type *)this;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (__k != pTVar2) {
    iVar12 = 0;
    do {
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)&local_1e8,&__k->name);
      *pmVar6 = iVar12;
      iVar12 = iVar12 + 1;
      __k = __k + 1;
    } while (__k != pTVar2);
  }
  pPVar11 = (language->productions).
            super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pPVar3 = (language->productions).
           super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_27c = iVar12;
  if (pPVar11 != pPVar3) {
    do {
      cVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::find(&local_1e8,&pPVar11->lhs);
      if ((_Rb_tree_header *)cVar7._M_node == p_Var1) {
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                               *)&local_1e8,&pPVar11->lhs);
        *pmVar6 = local_27c;
        local_27c = local_27c + 1;
      }
      pPVar11 = pPVar11 + 1;
    } while (pPVar11 != pPVar3);
  }
  local_240.symbol_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_240.symbol_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_240.productions.
  super__Vector_base<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_240.symbol_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_240.productions.
  super__Vector_base<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_240.productions.
  super__Vector_base<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_240.nsymbols = local_27c;
  pPVar11 = (language->productions).
            super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_248 = (language->productions).
              super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_240.nterminals = iVar12;
  if (pPVar11 != local_248) {
    do {
      pbStack_270 = (pointer)0x0;
      iStack_268._M_current = (int *)0x0;
      local_260 = (int *)0x0;
      cVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::find(&local_1e8,&pPVar11->lhs);
      if ((_Rb_tree_header *)cVar7._M_node == p_Var1) {
        fail("assertion %s failed at %s +%d\n","symbol_map.count(lang_prod.lhs)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_language.cpp"
             ,0x1f);
      }
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)&local_1e8,&pPVar11->lhs);
      local_278._0_4_ = *pmVar6;
      pbVar4 = (pPVar11->rhs).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (__k_00 = (pPVar11->rhs).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; __k_00 != pbVar4; __k_00 = __k_00 + 1
          ) {
        cVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::find(&local_1e8,__k_00);
        if ((_Rb_tree_header *)cVar7._M_node == p_Var1) {
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b8 + 0x10),"RHS entry \"",0xb);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)(local_1b8 + 0x10),(__k_00->_M_dataplus)._M_p,
                               __k_00->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,"\" is neither a nonterminal (LHS of a production) nor a token!\n",0x3e
                    );
          this_00 = (ParserFail *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          ParserFail::ParserFail(this_00,&local_208);
          __cxa_throw(this_00,&ParserFail::typeinfo,std::invalid_argument::~invalid_argument);
        }
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                               *)&local_1e8,__k_00);
        if (iStack_268._M_current == local_260) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&pbStack_270,iStack_268,pmVar6);
        }
        else {
          *iStack_268._M_current = *pmVar6;
          iStack_268._M_current = iStack_268._M_current + 1;
        }
      }
      std::vector<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>::
      emplace_back<Omega_h::Grammar::Production>(&local_240.productions,(Production *)local_278);
      if (pbStack_270 != (pointer)0x0) {
        operator_delete(pbStack_270,(long)local_260 - (long)pbStack_270);
      }
      pPVar11 = pPVar11 + 1;
    } while (pPVar11 != local_248);
  }
  local_1b8._8_8_ = 0;
  local_1a8[0]._M_local_buf[0] = '\0';
  local_1b8._0_8_ = local_1b8 + 0x10;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_208,(long)local_27c,(value_type *)local_1b8,(allocator_type *)local_278);
  iStack_268._M_current =
       (int *)local_240.symbol_names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pbStack_270 = local_240.symbol_names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_278 = (undefined1  [8])
              local_240.symbol_names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_240.symbol_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_208._M_dataplus._M_p;
  local_240.symbol_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_208._M_string_length;
  local_240.symbol_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_208.field_2._M_allocated_capacity;
  local_208._M_dataplus._M_p = (pointer)0x0;
  local_208._M_string_length = 0;
  local_208.field_2._M_allocated_capacity = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_278);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_208);
  p_Var8 = local_1e8._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
    operator_delete((void *)local_1b8._0_8_,
                    CONCAT71(local_1a8[0]._M_allocated_capacity._1_7_,local_1a8[0]._M_local_buf[0])
                    + 1);
    p_Var8 = local_1e8._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  while( true ) {
    if ((_Rb_tree_header *)p_Var8 == p_Var1) {
      add_end_terminal(&local_240);
      add_accept_production(&local_240);
      pPVar9 = (pointer)operator_new(0x48);
      peVar5 = local_250;
      *(undefined8 *)&(pPVar9->rhs).super__Vector_base<int,_std::allocator<int>_>._M_impl =
           0x100000001;
      *(undefined ***)pPVar9 = &PTR___Sp_counted_ptr_inplace_004c59e0;
      *(pointer *)((long)&(pPVar9->rhs).super__Vector_base<int,_std::allocator<int>_> + 8) =
           (pointer)CONCAT44(local_240.nterminals,local_240.nsymbols);
      *(pointer *)((long)&(pPVar9->rhs).super__Vector_base<int,_std::allocator<int>_> + 0x10) =
           local_240.productions.
           super__Vector_base<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>
           ._M_impl.super__Vector_impl_data._M_start;
      *(pointer *)(pPVar9 + 1) =
           local_240.productions.
           super__Vector_base<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      *(pointer *)&pPVar9[1].rhs.super__Vector_base<int,_std::allocator<int>_>._M_impl =
           local_240.productions.
           super__Vector_base<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_240.productions.
      super__Vector_base<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_240.productions.
      super__Vector_base<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_240.productions.
      super__Vector_base<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      *(pointer *)((long)&pPVar9[1].rhs.super__Vector_base<int,_std::allocator<int>_> + 8) =
           local_240.symbol_names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      *(pointer *)((long)&pPVar9[1].rhs.super__Vector_base<int,_std::allocator<int>_> + 0x10) =
           local_240.symbol_names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      *(pointer *)(pPVar9 + 2) =
           local_240.symbol_names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_240.symbol_names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_240.symbol_names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_240.symbol_names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      *(pointer **)local_250 =
           (pointer *)((long)&(pPVar9->rhs).super__Vector_base<int,_std::allocator<int>_> + 8);
      (local_250->productions).
      super__Vector_base<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>
      ._M_impl.super__Vector_impl_data._M_start = pPVar9;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_240.symbol_names);
      std::vector<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>::
      ~vector(&local_240.productions);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~_Rb_tree(&local_1e8);
      GVar13.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = extraout_RDX._M_pi;
      GVar13.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
      return (GrammarPtr)
             GVar13.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>;
    }
    if ((long)(int)p_Var8[2]._M_color < 0) break;
    std::__cxx11::string::_M_assign
              ((string *)
               (local_240.symbol_names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + (int)p_Var8[2]._M_color));
    p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
  }
  fail("assertion %s failed at %s +%d\n","0 <= i",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_std_vector.hpp"
       ,0x13);
}

Assistant:

GrammarPtr build_grammar(Language const& language) {
  std::map<std::string, int> symbol_map;
  int nterminals = 0;
  for (auto& token : language.tokens) {
    symbol_map[token.name] = nterminals++;
  }
  int nsymbols = nterminals;
  for (auto& production : language.productions) {
    if (symbol_map.count(production.lhs)) continue;
    symbol_map[production.lhs] = nsymbols++;
  }
  Grammar out;
  out.nsymbols = nsymbols;
  out.nterminals = nterminals;
  for (auto& lang_prod : language.productions) {
    Grammar::Production gprod;
    OMEGA_H_CHECK(symbol_map.count(lang_prod.lhs));
    gprod.lhs = symbol_map[lang_prod.lhs];
    for (auto& lang_symb : lang_prod.rhs) {
      if (!symbol_map.count(lang_symb)) {
        std::stringstream ss;
        ss << "RHS entry \"" << lang_symb
           << "\" is neither a nonterminal (LHS of a production) nor a "
              "token!\n";
        throw ParserFail(ss.str());
      }
      gprod.rhs.push_back(symbol_map[lang_symb]);
    }
    out.productions.emplace_back(std::move(gprod));
  }
  out.symbol_names = make_vector<std::string>(nsymbols);
  for (auto& pair : symbol_map) {
    at(out.symbol_names, pair.second) = pair.first;
  }
  add_end_terminal(out);
  add_accept_production(out);
  return std::make_shared<Grammar>(std::move(out));
}